

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O2

Ptr<ImageView> __thiscall
myvk::ImageView::Create(ImageView *this,Ptr<SwapchainImage> *swapchain_image)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<ImageView> PVar1;
  __shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  VkComponentMapping local_28;
  
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::SwapchainImage,void>
            (local_38,&swapchain_image->
                       super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>);
  local_28.r = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_28.g = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_28.b = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_28.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  Create(this,(Ptr<ImageBase> *)local_38,VK_IMAGE_VIEW_TYPE_2D,
         (((((swapchain_image->super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>)
            ._M_ptr)->m_swapchain_ptr).
           super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_swapchain_create_info).imageFormat,1,0,1,0,1,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ImageView>)PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<SwapchainImage> &swapchain_image) {
	return Create(swapchain_image, VK_IMAGE_VIEW_TYPE_2D, swapchain_image->GetSwapchainPtr()->GetImageFormat(),
	              VK_IMAGE_ASPECT_COLOR_BIT);
}